

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O0

Matcher<const_std::tr1::tuple<const_void_*,_long,_void,_void,_void,_void,_void,_void,_void,_void>_&>
* testing::A<std::tr1::tuple<void_const*,long,void,void,void,void,void,void,void,void>const&>(void)

{
  void *__s;
  Matcher<const_std::tr1::tuple<const_void_*,_long,_void,_void,_void,_void,_void,_void,_void,_void>_&>
  *in_RDI;
  MatcherInterface<const_std::tr1::tuple<const_void_*,_long,_void,_void,_void,_void,_void,_void,_void,_void>_&>
  *in_stack_ffffffffffffffd8;
  Matcher<const_std::tr1::tuple<const_void_*,_long,_void,_void,_void,_void,_void,_void,_void,_void>_&>
  *this;
  
  this = in_RDI;
  __s = operator_new(8);
  memset(__s,0,8);
  internal::
  AnyMatcherImpl<const_std::tr1::tuple<const_void_*,_long,_void,_void,_void,_void,_void,_void,_void,_void>_&>
  ::AnyMatcherImpl((AnyMatcherImpl<const_std::tr1::tuple<const_void_*,_long,_void,_void,_void,_void,_void,_void,_void,_void>_&>
                    *)this);
  MakeMatcher<std::tr1::tuple<void_const*,long,void,void,void,void,void,void,void,void>const&>
            (in_stack_ffffffffffffffd8);
  return in_RDI;
}

Assistant:

inline Matcher<T> A() { return MakeMatcher(new internal::AnyMatcherImpl<T>()); }